

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O1

uint8_t __thiscall nuraft::buffer_serializer::get_u8(buffer_serializer *this)

{
  uint8_t uVar1;
  size_t sVar2;
  size_t sVar3;
  byte *pbVar4;
  overflow_error *this_00;
  
  sVar2 = this->pos_;
  sVar3 = buffer::size(this->buf_);
  if (sVar2 + 1 <= sVar3) {
    pbVar4 = buffer::data_begin(this->buf_);
    uVar1 = pbVar4[this->pos_];
    pos(this,this->pos_ + 1);
    return uVar1;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

uint8_t buffer_serializer::get_u8() {
    uint8_t ret = 0;
    chk_length(ret);
    uint8_t* ptr = buf_.data_begin() + pos_;
    ret = ptr[0];
    pos( pos() + sizeof(ret) );
    return ret;
}